

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O2

Metric * __thiscall Metrics::NewMetric(Metrics *this,string *name)

{
  Metric *pMVar1;
  Metric *metric;
  
  pMVar1 = (Metric *)operator_new(0x30);
  (pMVar1->name)._M_dataplus._M_p = (pointer)&(pMVar1->name).field_2;
  (pMVar1->name)._M_string_length = 0;
  (pMVar1->name).field_2._M_local_buf[0] = '\0';
  metric = pMVar1;
  std::__cxx11::string::_M_assign((string *)pMVar1);
  pMVar1->count = 0;
  pMVar1->sum = 0;
  std::vector<Metric_*,_std::allocator<Metric_*>_>::push_back(&this->metrics_,&metric);
  return metric;
}

Assistant:

Metric* Metrics::NewMetric(const string& name) {
  Metric* metric = new Metric;
  metric->name = name;
  metric->count = 0;
  metric->sum = 0;
  metrics_.push_back(metric);
  return metric;
}